

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# User.h
# Opt level: O0

void __thiscall
User::User(User *this,int id,string *username,string *alias,string *bio,string *password)

{
  string *password_local;
  string *bio_local;
  string *alias_local;
  string *username_local;
  int id_local;
  User *this_local;
  
  std::__cxx11::string::string((string *)&this->username);
  std::__cxx11::string::string((string *)&this->alias);
  std::__cxx11::string::string((string *)&this->bio);
  std::__cxx11::string::string((string *)&this->password);
  this->id = id;
  std::__cxx11::string::operator=((string *)&this->username,(string *)username);
  std::__cxx11::string::operator=((string *)&this->alias,(string *)alias);
  std::__cxx11::string::operator=((string *)&this->bio,(string *)bio);
  std::__cxx11::string::operator=((string *)&this->password,(string *)password);
  return;
}

Assistant:

User(int id, std::string username, std::string alias, std::string bio, std::string password)
  {
	  this->id = id;
	  this->username = username;
	  this->alias = alias;
	  this->bio = bio;
	  this->password = password;
  }